

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               FilterMode levelFilter,LookupPrecision *prec,float coordX,int coordY,Vec2 *fBounds,
               Vec4 *result)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int i;
  TextureChannelClass TVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ConstPixelBufferAccess *pCVar14;
  Sampler *pSVar15;
  uint uVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint uVar18;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  uint uVar19;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Vec4 maxVal;
  Vector<float,_4> res_1;
  int w1;
  Vector<bool,_4> res_11;
  Vector<bool,_4> res_9;
  Vec4 minVal;
  Vec4 c0_1;
  ColorLine line0;
  Vector<float,_4> res_5;
  Vec2 uBounds1;
  Vec2 uBounds0;
  float local_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  Sampler *local_1a0;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  float local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  Vec4 local_178;
  ulong local_168 [3];
  ConstPixelBufferAccess *local_150;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  byte local_130 [8];
  Vec4 local_128;
  int local_114;
  int local_110;
  float local_10c;
  TextureFormat local_108;
  int aiStack_100 [2];
  float local_f8 [4];
  undefined1 local_e8 [32];
  void *local_c8;
  undefined8 uStack_c0;
  ConstPixelBufferAccess *local_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ulong local_48;
  undefined8 uStack_40;
  
  local_13c = (level0->m_size).m_data[0];
  iVar13 = (level1->m_size).m_data[0];
  local_1a0 = sampler;
  local_198 = coordX;
  local_150 = level0;
  local_134 = iVar13;
  local_b0 = level1;
  if (levelFilter == LINEAR) {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_a0,sampler->normalizedCoords,local_13c,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_a8,sampler->normalizedCoords,iVar13,local_198,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    fVar17 = floorf(local_a0 + -0.5);
    iVar13 = (int)fVar17;
    fVar17 = floorf(local_9c + -0.5);
    local_144 = (int)fVar17;
    local_198 = floorf(local_a8 + -0.5);
    local_188 = floorf(local_a4 + -0.5);
    TVar7 = getTextureChannelClass((level0->m_format).type);
    if (TVar7 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_1bc = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_1bc = 0.0;
      if (TVar7 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        local_1bc = computeBilinearSearchStepForUnorm(prec);
      }
    }
    bVar6 = iVar13 <= local_144;
    if (iVar13 <= local_144) {
      local_140 = (int)local_198;
      local_138 = (int)local_188;
      bVar6 = true;
      do {
        iVar9 = local_13c;
        pSVar15 = local_1a0;
        local_e8._16_4_ = 0.0;
        local_e8._20_4_ = 0.0;
        local_e8._24_4_ = 0;
        local_e8._28_4_ = 0;
        local_e8._0_4_ = R;
        local_e8._4_4_ = SNORM_INT8;
        local_e8._8_4_ = 0;
        local_e8._12_4_ = 0;
        iVar8 = TexVerifierUtil::wrap(local_1a0->wrapS,iVar13,local_13c);
        local_114 = iVar13 + 1;
        iVar9 = TexVerifierUtil::wrap(pSVar15->wrapS,local_114,iVar9);
        lookupLine((ColorLine *)local_e8,local_150,pSVar15,iVar8,iVar9,coordY);
        local_58 = ZEXT416((uint)local_1bc);
        if (TVar7 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          local_58._0_4_ = computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)local_e8);
          local_58._4_4_ = extraout_XMM0_Db;
          local_58._8_4_ = extraout_XMM0_Dc;
          local_58._12_4_ = extraout_XMM0_Dd;
        }
        if (local_140 <= local_138) {
          fVar21 = (local_a0 + -0.5) - (float)iVar13;
          fVar17 = 1.0;
          if (fVar21 <= 1.0) {
            fVar17 = fVar21;
          }
          local_68 = (ulong)(~-(uint)(fVar21 < 0.0) & (uint)fVar17);
          uStack_60 = 0;
          fVar21 = (local_9c + -0.5) - (float)iVar13;
          fVar17 = 1.0;
          if (fVar21 <= 1.0) {
            fVar17 = fVar21;
          }
          local_48 = (ulong)(~-(uint)(fVar21 < 0.0) & (uint)fVar17);
          uStack_40 = 0;
          iVar13 = local_140;
          do {
            iVar9 = local_134;
            pSVar15 = local_1a0;
            local_f8[0] = 0.0;
            local_f8[1] = 0.0;
            local_f8[2] = 0.0;
            local_f8[3] = 0.0;
            local_108.order = R;
            local_108.type = SNORM_INT8;
            aiStack_100[0] = 0;
            aiStack_100[1] = 0;
            iVar8 = TexVerifierUtil::wrap(local_1a0->wrapS,iVar13,local_134);
            local_110 = iVar13 + 1;
            iVar9 = TexVerifierUtil::wrap(pSVar15->wrapS,local_110,iVar9);
            lookupLine((ColorLine *)&local_108,local_b0,pSVar15,iVar8,iVar9,coordY);
            uVar18 = 0;
            uVar19 = 0;
            uVar20 = 0;
            fVar17 = local_1bc;
            if (TVar7 == TEXTURECHANNELCLASS_FLOATING_POINT) {
              fVar17 = computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)&local_108);
              uVar18 = extraout_XMM0_Db_00;
              uVar19 = extraout_XMM0_Dc_00;
              uVar20 = extraout_XMM0_Dd_00;
            }
            fVar22 = (local_a8 + -0.5) - (float)iVar13;
            fVar24 = (local_a4 + -0.5) - (float)iVar13;
            fVar21 = 1.0;
            if (fVar24 <= 1.0) {
              fVar21 = fVar24;
            }
            local_1b8 = 0;
            uStack_1b0 = 0;
            lVar10 = 0;
            do {
              uVar16 = -(uint)(*(float *)(local_e8 + lVar10 * 4) <=
                              *(float *)(local_e8 + lVar10 * 4 + 0x10));
              *(uint *)((long)&local_1b8 + lVar10 * 4) =
                   ~uVar16 & (uint)*(float *)(local_e8 + lVar10 * 4 + 0x10) |
                   (uint)*(float *)(local_e8 + lVar10 * 4) & uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_168[0] = 0;
            local_168[1] = 0;
            lVar10 = 0;
            do {
              fVar23 = *(float *)((long)(((ColorLine *)&local_108)->p0).m_data + lVar10 * 4);
              uVar16 = -(uint)(fVar23 <= local_f8[lVar10]);
              *(uint *)((long)local_168 + lVar10 * 4) =
                   ~uVar16 & (uint)local_f8[lVar10] | (uint)fVar23 & uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            fVar23 = 1.0;
            if (fVar22 <= 1.0) {
              fVar23 = fVar22;
            }
            fVar21 = (float)(~-(uint)(fVar24 < 0.0) & (uint)fVar21);
            local_178.m_data[0] = 0.0;
            local_178.m_data[1] = 0.0;
            local_178.m_data[2] = 0.0;
            local_178.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              fVar24 = *(float *)((long)&local_1b8 + lVar10 * 4);
              fVar1 = *(float *)((long)local_168 + lVar10 * 4);
              uVar16 = -(uint)(fVar24 <= fVar1);
              local_178.m_data[lVar10] = (float)(~uVar16 & (uint)fVar1 | (uint)fVar24 & uVar16);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_128.m_data[0] = 0.0;
            local_128.m_data[1] = 0.0;
            local_128.m_data[2] = 0.0;
            local_128.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              local_128.m_data[lVar10] =
                   local_178.m_data[lVar10] - (prec->colorThreshold).m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_168[0] = 0;
            local_168[1] = 0;
            lVar10 = 0;
            do {
              uVar16 = -(uint)(*(float *)(local_e8 + lVar10 * 4 + 0x10) <=
                              *(float *)(local_e8 + lVar10 * 4));
              *(uint *)((long)local_168 + lVar10 * 4) =
                   ~uVar16 & (uint)*(float *)(local_e8 + lVar10 * 4 + 0x10) |
                   (uint)*(float *)(local_e8 + lVar10 * 4) & uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_c8 = (void *)0x0;
            uStack_c0 = 0;
            lVar10 = 0;
            do {
              fVar24 = *(float *)((long)(((ColorLine *)&local_108)->p0).m_data + lVar10 * 4);
              uVar16 = -(uint)(local_f8[lVar10] <= fVar24);
              *(uint *)((long)&local_c8 + lVar10 * 4) =
                   ~uVar16 & (uint)local_f8[lVar10] | (uint)fVar24 & uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_1b8 = 0;
            uStack_1b0 = 0;
            lVar10 = 0;
            do {
              fVar24 = *(float *)((long)local_168 + lVar10 * 4);
              fVar1 = *(float *)((long)&local_c8 + lVar10 * 4);
              uVar16 = -(uint)(fVar1 <= fVar24);
              *(uint *)((long)&local_1b8 + lVar10 * 4) =
                   ~uVar16 & (uint)fVar1 | (uint)fVar24 & uVar16;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_178.m_data[0] = 0.0;
            local_178.m_data[1] = 0.0;
            local_178.m_data[2] = 0.0;
            local_178.m_data[3] = 0.0;
            lVar10 = 0;
            do {
              local_178.m_data[lVar10] =
                   *(float *)((long)&local_1b8 + lVar10 * 4) + (prec->colorThreshold).m_data[lVar10]
              ;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_c8 = (void *)((ulong)local_c8 & 0xffffffff00000000);
            lVar10 = 0;
            do {
              *(bool *)((long)&local_c8 + lVar10) =
                   local_128.m_data[lVar10] <= result->m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_130[4] = 0;
            local_130[5] = 0;
            local_130[6] = 0;
            local_130[7] = 0;
            lVar10 = 0;
            do {
              local_130[lVar10 + 4] = result->m_data[lVar10] <= local_178.m_data[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_168[0] = local_168[0] & 0xffffffff00000000;
            lVar10 = 0;
            do {
              *(byte *)((long)local_168 + lVar10) =
                   local_130[lVar10 + 4] & *(byte *)((long)&local_c8 + lVar10);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_130[0] = 0;
            local_130[1] = 0;
            local_130[2] = 0;
            local_130[3] = 0;
            lVar10 = 0;
            do {
              local_130[lVar10] = (prec->colorMask).m_data[lVar10] ^ 1;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_1b8 = local_1b8 & 0xffffffff00000000;
            lVar10 = 0;
            do {
              *(byte *)((long)&local_1b8 + lVar10) =
                   local_130[lVar10] | *(byte *)((long)local_168 + lVar10);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            if (local_1b8._0_1_ != (TexVerifierUtil)0x0) {
              fVar23 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar23);
              local_78 = ZEXT416((uint)fVar23);
              local_188 = (float)(~-(uint)((float)local_58._0_4_ <= fVar17) & (uint)fVar17 |
                                 -(uint)((float)local_58._0_4_ <= fVar17) & local_58._0_4_);
              uStack_184 = ~local_58._4_4_ & uVar18 | local_58._4_4_;
              uStack_180 = ~local_58._8_4_ & uVar19 | local_58._8_4_;
              uStack_17c = ~local_58._12_4_ & uVar20 | local_58._12_4_;
              uVar11 = 0xffffffffffffffff;
              do {
                if (uVar11 == 2) {
                  uVar12 = 3;
                  break;
                }
                uVar12 = uVar11 + 1;
                lVar10 = uVar11 + 2;
                uVar11 = uVar12;
              } while (*(char *)((long)&local_1b8 + lVar10) != '\0');
              if (2 < uVar12) {
                local_10c = (float)local_48 + local_188;
                bVar4 = (float)local_68 < local_10c;
                if ((float)local_68 < local_10c) {
                  bVar2 = fVar21 < fVar23;
                  bVar4 = true;
                  local_88 = ZEXT416((uint)fVar21);
                  fVar17 = (float)local_68;
                  uStack_94 = local_68._4_4_;
                  uStack_90 = (undefined4)uStack_60;
                  uStack_8c = uStack_60._4_4_;
                  do {
                    fVar22 = (float)(~-(uint)(fVar17 <= (float)local_48) & (uint)(float)local_48 |
                                    -(uint)(fVar17 <= (float)local_48) & (uint)fVar17);
                    local_178.m_data[0] = 0.0;
                    local_178.m_data[1] = 0.0;
                    local_178.m_data[2] = 0.0;
                    local_178.m_data[3] = 0.0;
                    lVar10 = 0;
                    do {
                      local_178.m_data[lVar10] = *(float *)(local_e8 + lVar10 * 4) * (1.0 - fVar22);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 4);
                    local_1b8 = 0;
                    uStack_1b0 = 0;
                    lVar10 = 0;
                    do {
                      *(float *)((long)&local_1b8 + lVar10 * 4) =
                           *(float *)(local_e8 + lVar10 * 4 + 0x10) * fVar22;
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 4);
                    local_128.m_data[0] = 0.0;
                    local_128.m_data[1] = 0.0;
                    local_128.m_data[2] = 0.0;
                    local_128.m_data[3] = 0.0;
                    lVar10 = 0;
                    do {
                      local_128.m_data[lVar10] =
                           local_178.m_data[lVar10] + *(float *)((long)&local_1b8 + lVar10 * 4);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 4);
                    local_98 = fVar17;
                    if ((float)local_78._0_4_ <= fVar21) {
                      fVar17 = (float)local_78._0_4_;
                      uStack_194 = local_78._4_4_;
                      uStack_190 = local_78._8_4_;
                      uStack_18c = local_78._12_4_;
                      bVar3 = bVar2;
                      do {
                        fVar21 = (float)(~-(uint)(fVar17 <= fVar21) & (uint)fVar21 |
                                        -(uint)(fVar17 <= fVar21) & (uint)fVar17);
                        local_1b8 = 0;
                        uStack_1b0 = 0;
                        lVar10 = 0;
                        do {
                          *(float *)((long)&local_1b8 + lVar10 * 4) =
                               *(float *)((long)(((ColorLine *)&local_108)->p0).m_data + lVar10 * 4)
                               * (1.0 - fVar21);
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 4);
                        local_168[0] = 0;
                        local_168[1] = 0;
                        lVar10 = 0;
                        do {
                          *(float *)((long)local_168 + lVar10 * 4) = local_f8[lVar10] * fVar21;
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 4);
                        local_178.m_data[0] = 0.0;
                        local_178.m_data[1] = 0.0;
                        local_178.m_data[2] = 0.0;
                        local_178.m_data[3] = 0.0;
                        lVar10 = 0;
                        do {
                          local_178.m_data[lVar10] =
                               *(float *)((long)&local_1b8 + lVar10 * 4) +
                               *(float *)((long)local_168 + lVar10 * 4);
                          lVar10 = lVar10 + 1;
                        } while (lVar10 != 4);
                        local_198 = fVar17;
                        bVar5 = isLinearRangeValid(prec,&local_128,&local_178,fBounds,result);
                        fVar21 = (float)local_88._0_4_;
                        if (bVar5) {
                          if (!bVar3) goto LAB_00ab65b1;
                          break;
                        }
                        fVar17 = local_198 + local_188;
                        bVar3 = (float)local_88._0_4_ < fVar17;
                      } while (!bVar3);
                    }
                    fVar17 = local_98 + local_188;
                    bVar4 = fVar17 < local_10c;
                  } while (fVar17 < local_10c);
                }
LAB_00ab65b1:
                if (bVar4) {
                  return bVar6;
                }
              }
            }
            iVar13 = local_110;
          } while (local_110 <= local_138);
        }
        bVar6 = local_114 <= local_144;
        iVar13 = local_114;
      } while (local_114 <= local_144);
    }
  }
  else {
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_178,sampler->normalizedCoords,local_13c,coordX,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    TexVerifierUtil::computeNonNormalizedCoordBounds
              ((TexVerifierUtil *)&local_1b8,sampler->normalizedCoords,iVar13,local_198,
               (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
    local_198 = local_178.m_data[1];
    fVar17 = floorf(local_178.m_data[0]);
    iVar13 = (int)fVar17;
    fVar17 = floorf(local_198);
    pCVar14 = local_150;
    iVar9 = (int)fVar17;
    local_198 = local_1b8._4_4_;
    local_188 = floorf((float)local_1b8);
    fVar17 = floorf(local_198);
    local_88._0_4_ = iVar9;
    bVar6 = iVar13 <= iVar9;
    if (iVar13 <= iVar9) {
      local_98 = (float)(int)local_188;
      fVar17 = (float)(int)fVar17;
      bVar6 = true;
      local_198 = (float)iVar13;
      local_188 = fVar17;
      do {
        fVar21 = local_98;
        if ((int)local_98 <= (int)fVar17) {
          do {
            iVar13 = TexVerifierUtil::wrap(local_1a0->wrapS,(int)local_198,local_13c);
            pSVar15 = local_1a0;
            if ((((iVar13 < 0) || ((pCVar14->m_size).m_data[0] <= iVar13)) || (coordY < 0)) ||
               (((pCVar14->m_size).m_data[1] <= coordY || ((pCVar14->m_size).m_data[2] < 1)))) {
              sampleTextureBorder<float>((tcu *)&local_108,&pCVar14->m_format,local_1a0);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_e8,(int)pCVar14,iVar13,coordY);
              bVar4 = isSRGB(pCVar14->m_format);
              if (bVar4) {
                sRGBToLinear((tcu *)&local_108,(Vec4 *)local_e8);
                pSVar15 = local_1a0;
                fVar17 = local_188;
              }
              else {
                local_108.order = local_e8._0_4_;
                local_108.type = local_e8._4_4_;
                aiStack_100[0] = local_e8._8_4_;
                aiStack_100[1] = local_e8._12_4_;
                pSVar15 = local_1a0;
                fVar17 = local_188;
              }
            }
            iVar13 = TexVerifierUtil::wrap(pSVar15->wrapS,(int)fVar21,local_134);
            pCVar14 = local_b0;
            if (((iVar13 < 0) || ((local_b0->m_size).m_data[0] <= iVar13)) ||
               ((coordY < 0 ||
                (((local_b0->m_size).m_data[1] <= coordY || ((local_b0->m_size).m_data[2] < 1))))))
            {
              sampleTextureBorder<float>((tcu *)&local_128,&local_b0->m_format,local_1a0);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_e8,(int)local_b0,iVar13,coordY);
              bVar4 = isSRGB(pCVar14->m_format);
              fVar17 = local_188;
              if (bVar4) {
                sRGBToLinear((tcu *)&local_128,(Vec4 *)local_e8);
                fVar17 = local_188;
              }
            }
            pCVar14 = local_150;
            bVar4 = isLinearRangeValid(prec,(Vec4 *)&local_108,&local_128,fBounds,result);
            if (bVar4) {
              return bVar6;
            }
            fVar21 = (float)((int)fVar21 + 1);
          } while ((int)fVar21 <= (int)fVar17);
        }
        local_198 = (float)((int)local_198 + 1);
        bVar6 = (int)local_198 <= (int)local_88._0_4_;
      } while ((int)local_198 <= (int)local_88._0_4_);
    }
  }
  return bVar6;
}

Assistant:

static bool isMipmapLinearSampleResultValid (const ConstPixelBufferAccess&		level0,
										     const ConstPixelBufferAccess&		level1,
											 const Sampler&						sampler,
										     const Sampler::FilterMode			levelFilter,
										     const LookupPrecision&				prec,
										     const float						coordX,
											 const int							coordY,
										     const Vec2&						fBounds,
										     const Vec4&						result)
{
	if (levelFilter == Sampler::LINEAR)
		return isLinearMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
	else
		return isNearestMipmapLinearSampleResultValid(level0, level1, sampler, prec, coordX, coordY, fBounds, result);
}